

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gosthash2012.c
# Opt level: O0

void gost2012_hash_block(gost2012_hash_ctx *CTX,uchar *data,size_t len)

{
  gost2012_hash_ctx *CTX_00;
  uint512_u *in_RDX;
  uchar *in_RSI;
  void *in_RDI;
  size_t chunksize;
  size_t bufsize;
  uint512_u *in_stack_ffffffffffffffd8;
  uint512_u *data_00;
  uint512_u *local_18;
  uchar *local_10;
  
  CTX_00 = *(gost2012_hash_ctx **)((long)in_RDI + 0x100);
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (CTX_00 == (gost2012_hash_ctx *)0x0) {
    for (; (uint512_u *)0x3f < local_18; local_18 = local_18 + -1) {
      memcpy(in_RDI,local_10,0x40);
      stage2(CTX_00,in_stack_ffffffffffffffd8);
      local_10 = local_10 + 0x40;
    }
  }
  while (local_18 != (uint512_u *)0x0) {
    data_00 = (uint512_u *)(0x40U - (long)CTX_00);
    if (local_18 < (uint512_u *)(0x40U - (long)CTX_00)) {
      data_00 = local_18;
    }
    memcpy((uchar *)((long)in_RDI + (long)CTX_00),local_10,(size_t)data_00);
    CTX_00 = (gost2012_hash_ctx *)(data_00->B + (long)CTX_00);
    local_18 = (uint512_u *)((long)local_18 - (long)data_00);
    local_10 = data_00->B + (long)local_10;
    if (CTX_00 == (gost2012_hash_ctx *)0x40) {
      stage2((gost2012_hash_ctx *)0x40,data_00);
      CTX_00 = (gost2012_hash_ctx *)0x0;
    }
  }
  *(gost2012_hash_ctx **)((long)in_RDI + 0x100) = CTX_00;
  return;
}

Assistant:

void gost2012_hash_block(gost2012_hash_ctx * CTX,
                         const unsigned char *data, size_t len)
{
    register size_t bufsize = CTX->bufsize;

    if (bufsize == 0) {
        while (len >= 64) {
            memcpy(&CTX->buffer.B[0], data, 64);
            stage2(CTX, &(CTX->buffer));
            data += 64;
            len -= 64;
        }
    }

    while (len) {
        register size_t chunksize = 64 - bufsize;
        if (chunksize > len)
            chunksize = len;

        memcpy(&CTX->buffer.B[bufsize], data, chunksize);

        bufsize += chunksize;
        len -= chunksize;
        data += chunksize;

        if (bufsize == 64) {
            stage2(CTX, &(CTX->buffer) );
            bufsize = 0;
        }
    }
    CTX->bufsize = bufsize;
}